

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::WritePools(cmLocalNinjaGenerator *this,ostream *os)

{
  cmState *this_00;
  cmMakefile *this_01;
  int iVar1;
  cmValue cVar2;
  long lVar3;
  ostream *poVar4;
  pointer __rhs;
  string_view arg;
  uint jobs;
  string local_70;
  ostream *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pools;
  
  local_50 = os;
  cmGlobalNinjaGenerator::WriteDivider(os);
  this_00 = (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
             CMakeInstance->State)._M_t.
            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"JOB_POOLS",(allocator<char> *)&pools);
  cVar2 = cmState::GetGlobalProperty(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (cVar2.Value == (string *)0x0) {
    this_01 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CMAKE_JOB_POOLS",(allocator<char> *)&pools);
    cVar2 = cmMakefile::GetDefinition(this_01,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (cVar2.Value == (string *)0x0) {
      return;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Pools defined by global property JOB_POOLS",
             (allocator<char> *)&pools);
  cmGlobalNinjaGenerator::WriteComment(local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
  arg._M_len = (cVar2.Value)->_M_string_length;
  cmExpandedList_abi_cxx11_(&pools,arg,false);
  for (__rhs = pools.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __rhs != pools.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
    lVar3 = std::__cxx11::string::find((char)__rhs,0x3d);
    if ((lVar3 == -1) ||
       (iVar1 = __isoc99_sscanf((__rhs->_M_dataplus)._M_p + lVar3,"=%u",&jobs), iVar1 != 1)) {
      std::operator+(&local_70,"Invalid pool defined by property \'JOB_POOLS\': ",__rhs);
      cmSystemTools::Error(&local_70);
    }
    else {
      poVar4 = std::operator<<(local_50,"pool ");
      std::__cxx11::string::substr((ulong)&local_70,(ulong)__rhs);
      poVar4 = std::operator<<(poVar4,(string *)&local_70);
      poVar4 = std::operator<<(poVar4,"\n  depth = ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"\n\n");
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pools);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WritePools(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);

  cmValue jobpools =
    this->GetCMakeInstance()->GetState()->GetGlobalProperty("JOB_POOLS");
  if (!jobpools) {
    jobpools = this->GetMakefile()->GetDefinition("CMAKE_JOB_POOLS");
  }
  if (jobpools) {
    cmGlobalNinjaGenerator::WriteComment(
      os, "Pools defined by global property JOB_POOLS");
    std::vector<std::string> pools = cmExpandedList(*jobpools);
    for (std::string const& pool : pools) {
      const std::string::size_type eq = pool.find('=');
      unsigned int jobs;
      if (eq != std::string::npos &&
          sscanf(pool.c_str() + eq, "=%u", &jobs) == 1) {
        os << "pool " << pool.substr(0, eq) << "\n  depth = " << jobs
           << "\n\n";
      } else {
        cmSystemTools::Error("Invalid pool defined by property 'JOB_POOLS': " +
                             pool);
      }
    }
  }
}